

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O0

bool __thiscall RenX_Ladder_WebPlugin::initialize(RenX_Ladder_WebPlugin *this)

{
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  uVar1;
  undefined1 *puVar2;
  pointer pCVar3;
  basic_string_view<char,_std::char_traits<char>_> *__svt;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  local_1a8;
  __sv_type local_1a0;
  __sv_type local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  __sv_type local_160;
  undefined1 local_150 [32];
  __sv_type local_130;
  __sv_type local_120;
  undefined1 local_110 [8];
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  content;
  Server *server;
  undefined8 local_f8;
  size_t local_f0;
  char *local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  RenX_Ladder_WebPlugin *local_10;
  RenX_Ladder_WebPlugin *this_local;
  
  puVar2 = &this->field_0x38;
  local_10 = this;
  local_30 = sv("LadderPageName",0xe);
  local_40 = sv("",0);
  local_20 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (puVar2,local_30._M_len,local_30._M_str,local_40._M_len,local_40._M_str);
  std::__cxx11::string::operator=((string *)&this->ladder_page_name,&local_20);
  local_60 = sv("SearchPageName",0xe);
  local_70 = sv("search",6);
  local_50 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (puVar2,local_60._M_len,local_60._M_str,local_70._M_len,local_70._M_str);
  std::__cxx11::string::operator=((string *)&this->search_page_name,&local_50);
  local_90 = sv("ProfilePageName",0xf);
  local_a0 = sv("profile",7);
  local_80 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (puVar2,local_90._M_len,local_90._M_str,local_a0._M_len,local_a0._M_str);
  std::__cxx11::string::operator=((string *)&this->profile_page_name,&local_80);
  local_c0 = sv("Hostname",8);
  local_d0 = sv("",0);
  local_b0 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (puVar2,local_c0._M_len,local_c0._M_str,local_d0._M_len,local_d0._M_str);
  std::__cxx11::string::operator=((string *)&this->web_hostname,&local_b0);
  bVar4 = sv("Path",4);
  bVar5 = sv("/",1);
  local_f0 = bVar4._M_len;
  local_e8 = bVar4._M_str;
  server = (Server *)bVar5._M_len;
  local_f8 = bVar5._M_str;
  local_e0 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get(puVar2,local_f0,local_e8,server,local_f8);
  __svt = &local_e0;
  std::__cxx11::string::operator=((string *)&this->web_path,__svt);
  init(this,(EVP_PKEY_CTX *)__svt);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )getHTTPServer();
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->ladder_page_name);
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_110);
  *(undefined8 *)(pCVar3 + 0x40) = 2;
  *(undefined8 *)(pCVar3 + 0x48) = 0x125846;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_110);
  *(undefined8 *)(pCVar3 + 0x50) = 9;
  *(undefined8 *)(pCVar3 + 0x58) = 0x125849;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_110);
  uVar1 = content;
  *(undefined8 *)(pCVar3 + 0x60) = 5;
  *(undefined8 *)(pCVar3 + 0x68) = 0x125853;
  local_120 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->web_hostname);
  local_130 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->web_path);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)(local_150 + 0x18),
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)local_110);
  Jupiter::HTTP::Server::hook
            (uVar1._M_t.
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl,
             local_120._M_len,local_120._M_str,local_130._M_len,local_130._M_str,
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)(local_150 + 0x18));
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)(local_150 + 0x18));
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->search_page_name);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  operator=((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)local_110,
            (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)local_150);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_150);
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_110);
  *(undefined8 *)(pCVar3 + 0x40) = 2;
  *(undefined8 *)(pCVar3 + 0x48) = 0x125846;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_110);
  *(undefined8 *)(pCVar3 + 0x50) = 9;
  *(undefined8 *)(pCVar3 + 0x58) = 0x125849;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_110);
  uVar1 = content;
  *(undefined8 *)(pCVar3 + 0x60) = 5;
  *(undefined8 *)(pCVar3 + 0x68) = 0x125853;
  local_160 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->web_hostname);
  local_180.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->web_path);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)&local_180._M_string_length,
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)local_110);
  Jupiter::HTTP::Server::hook
            (uVar1._M_t.
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl,
             local_160._M_len,local_160._M_str,local_180.field_2._M_allocated_capacity,
             local_180.field_2._8_8_,&local_180._M_string_length);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)&local_180._M_string_length);
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            (&local_180,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->profile_page_name);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  operator=((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)local_110,
            (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)&local_180);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)&local_180);
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_110);
  *(undefined8 *)(pCVar3 + 0x40) = 2;
  *(undefined8 *)(pCVar3 + 0x48) = 0x125846;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_110);
  *(undefined8 *)(pCVar3 + 0x50) = 9;
  *(undefined8 *)(pCVar3 + 0x58) = 0x125849;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_110);
  uVar1 = content;
  *(undefined8 *)(pCVar3 + 0x60) = 5;
  *(undefined8 *)(pCVar3 + 0x68) = 0x125853;
  local_190 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->web_hostname);
  local_1a0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->web_path);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  unique_ptr(&local_1a8,
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)local_110);
  Jupiter::HTTP::Server::hook
            (uVar1._M_t.
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl,
             local_190._M_len,local_190._M_str,local_1a0._M_len,local_1a0._M_str,&local_1a8);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr(&local_1a8);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_110);
  return true;
}

Assistant:

bool RenX_Ladder_WebPlugin::initialize() {
	RenX_Ladder_WebPlugin::ladder_page_name = this->config.get("LadderPageName"sv, ""sv);
	RenX_Ladder_WebPlugin::search_page_name = this->config.get("SearchPageName"sv, "search"sv);
	RenX_Ladder_WebPlugin::profile_page_name = this->config.get("ProfilePageName"sv, "profile"sv);
	RenX_Ladder_WebPlugin::web_hostname = this->config.get("Hostname"sv, ""sv);
	RenX_Ladder_WebPlugin::web_path = this->config.get("Path"sv, "/"sv);

	this->init();

	/** Initialize content */
	Jupiter::HTTP::Server &server = getHTTPServer();

	std::unique_ptr<Jupiter::HTTP::Server::Content> content = std::make_unique<Jupiter::HTTP::Server::Content>(RenX_Ladder_WebPlugin::ladder_page_name, handle_ladder_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = Jupiter::HTTP::Content::Type::Text::HTML;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	server.hook(RenX_Ladder_WebPlugin::web_hostname, RenX_Ladder_WebPlugin::web_path, std::move(content));

	content = std::make_unique<Jupiter::HTTP::Server::Content>(RenX_Ladder_WebPlugin::search_page_name, handle_search_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = Jupiter::HTTP::Content::Type::Text::HTML;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	server.hook(RenX_Ladder_WebPlugin::web_hostname, RenX_Ladder_WebPlugin::web_path, std::move(content));

	content = std::make_unique<Jupiter::HTTP::Server::Content>(RenX_Ladder_WebPlugin::profile_page_name, handle_profile_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = Jupiter::HTTP::Content::Type::Text::HTML;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	server.hook(RenX_Ladder_WebPlugin::web_hostname, RenX_Ladder_WebPlugin::web_path, std::move(content));

	return true;
}